

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileStdio.cpp
# Opt level: O1

void __thiscall adios2::transport::FileStdio::CheckFile(FileStdio *this,string *hint)

{
  size_type sVar1;
  int iVar2;
  int *piVar3;
  char *__s;
  long *plVar4;
  long *plVar5;
  size_type *psVar6;
  string errmsg;
  string local_110;
  string local_f0;
  string local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if ((FILE *)this->m_File == (FILE *)0x0) {
    local_110._M_string_length = 0;
    local_110.field_2._M_local_buf[0] = '\0';
    local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
    piVar3 = __errno_location();
    if (*piVar3 != 0) {
      __s = strerror(*piVar3);
      sVar1 = local_110._M_string_length;
      strlen(__s);
      std::__cxx11::string::_M_replace((ulong)&local_110,0,(char *)sVar1,(ulong)__s);
    }
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"Toolkit","");
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_f0,"transport::file::FileStdio","");
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"CheckFile","");
    std::operator+(&local_50,"ERROR: ",hint);
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
    plVar5 = plVar4 + 2;
    if ((long *)*plVar4 == plVar5) {
      local_80 = *plVar5;
      lStack_78 = plVar4[3];
      local_90 = &local_80;
    }
    else {
      local_80 = *plVar5;
      local_90 = (long *)*plVar4;
    }
    local_88 = plVar4[1];
    *plVar4 = (long)plVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_90,(ulong)local_110._M_dataplus._M_p);
    psVar6 = (size_type *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar6) {
      local_70.field_2._M_allocated_capacity = *psVar6;
      local_70.field_2._8_8_ = plVar4[3];
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    }
    else {
      local_70.field_2._M_allocated_capacity = *psVar6;
      local_70._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_70._M_string_length = plVar4[1];
    *plVar4 = (long)psVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    helper::Throw<std::ios_base::failure[abi:cxx11]>(&local_d0,&local_f0,&local_b0,&local_70,-1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    if (local_90 != &local_80) {
      operator_delete(local_90);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p == &local_110.field_2) {
      return;
    }
  }
  else {
    iVar2 = ferror((FILE *)this->m_File);
    if (iVar2 == 0) {
      return;
    }
    local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"Toolkit","");
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_d0,"transport::file::FileStdio","");
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"CheckFile","");
    std::operator+(&local_b0,"ERROR: ",hint);
    helper::Throw<std::ios_base::failure[abi:cxx11]>(&local_110,&local_d0,&local_f0,&local_b0,-1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p == &local_110.field_2) {
      return;
    }
  }
  operator_delete(local_110._M_dataplus._M_p);
  return;
}

Assistant:

void FileStdio::CheckFile(const std::string hint) const
{
    if (!m_File)
    {
        std::string errmsg;
        if (errno)
        {
            errmsg = std::strerror(errno);
        }
        helper::Throw<std::ios_base::failure>("Toolkit", "transport::file::FileStdio", "CheckFile",
                                              "ERROR: " + hint + ":" + errmsg);
    }
    else if (std::ferror(m_File))
    {
        helper::Throw<std::ios_base::failure>("Toolkit", "transport::file::FileStdio", "CheckFile",
                                              "ERROR: " + hint);
    }
}